

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O2

istream * operator>>(istream *is,SSTableDataEntry *s)

{
  std::istream::read((char *)is,(long)s);
  std::istream::read((char *)is,(long)&s->timestamp);
  std::istream::read((char *)is,(long)&s->key);
  std::istream::read((char *)is,(long)&s->value_length);
  bytes_read<std::__cxx11::string>(is,&s->value,s->value_length);
  return is;
}

Assistant:

std::istream &operator>>(std::istream &is, SSTableDataEntry &s) {
    bytes_read(is, &s.delete_flag);
    bytes_read(is, &s.timestamp);
    bytes_read(is, &s.key);
    bytes_read(is, &s.value_length);
    bytes_read(is, &s.value, s.value_length);
    return is;
}